

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>
            ((Bounded<5UL,_unsigned_short>)0x3,(Bounded<5UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>
            ((Bounded<5UL,_unsigned_short>)0x3,(Bounded<5UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x2,(Bounded<4UL,_unsigned_short>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x2,(Bounded<4UL,_unsigned_short>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>
            ((Bounded<5UL,_unsigned_char>)0x4,(Bounded<5UL,_unsigned_char>)0x4);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>
            ((Bounded<5UL,_unsigned_char>)0x4,(Bounded<5UL,_unsigned_char>)0x4);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>
            ((Bounded<4UL,_unsigned_char>)0x2,(Bounded<4UL,_unsigned_char>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>
            ((Bounded<4UL,_unsigned_char>)0x2,(Bounded<4UL,_unsigned_char>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  return;
}

Assistant:

TEST(UnitMeasure, BoundedMinMax) {
  assertTypeAndValue(bounded<5>(), kj::max(bounded<4>(), bounded<5>()));
  assertTypeAndValue(bounded<5>(), kj::max(bounded<5>(), bounded<4>()));
  assertTypeAndValue(bounded<4>(), kj::max(bounded<4>(), bounded<4>()));

  assertTypeAndValue(bounded<4>(), kj::min(bounded<4>(), bounded<5>()));
  assertTypeAndValue(bounded<4>(), kj::min(bounded<5>(), bounded<4>()));
  assertTypeAndValue(bounded<4>(), kj::min(bounded<4>(), bounded<4>()));

  typedef uint8_t t1;
  typedef uint16_t t2;

  assertTypeAndValue(boundedValue<5,t2>(3), kj::max(boundedValue<4,t2>(3), boundedValue<5,t1>(2)));
  assertTypeAndValue(boundedValue<5,t2>(3), kj::max(boundedValue<5,t1>(2), boundedValue<4,t2>(3)));
  assertTypeAndValue(boundedValue<4,t2>(3), kj::max(boundedValue<4,t2>(3), boundedValue<4,t2>(3)));

  assertTypeAndValue(boundedValue<4,t2>(2), kj::min(boundedValue<4,t2>(3), boundedValue<5,t1>(2)));
  assertTypeAndValue(boundedValue<4,t2>(2), kj::min(boundedValue<5,t1>(2), boundedValue<4,t2>(3)));
  assertTypeAndValue(boundedValue<4,t2>(3), kj::min(boundedValue<4,t2>(3), boundedValue<4,t2>(3)));

  assertTypeAndValue(boundedValue<5,t1>(4), kj::max(bounded<4>(), boundedValue<5,t1>(2)));
  assertTypeAndValue(boundedValue<5,t1>(4), kj::max(boundedValue<5,t1>(2), bounded<4>()));

  assertTypeAndValue(boundedValue<4,t1>(2), kj::min(bounded<4>(), boundedValue<5,t1>(2)));
  assertTypeAndValue(boundedValue<4,t1>(2), kj::min(boundedValue<5,t1>(2), bounded<4>()));

  // These two are degenerate cases. Currently they fail to compile but maybe they shouldn't?
//  assertTypeAndValue(bounded<5>(), kj::max(boundedValue<4,t2>(3), bounded<5>()));
//  assertTypeAndValue(bounded<5>(), kj::max(bounded<5>(), boundedValue<4,t2>(3)));

  assertTypeAndValue(boundedValue<4,t2>(3), kj::min(boundedValue<4,t2>(3), bounded<5>()));
  assertTypeAndValue(boundedValue<4,t2>(3), kj::min(bounded<5>(), boundedValue<4,t2>(3)));
}